

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::xpression_linker<char>::
alt_branch_link<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (xpression_linker<char> *this,
          shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *xpr,void *next,xpression_peeker<char> *peeker)

{
  iterator *piVar1;
  _Elt_pointer ppvVar2;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar3;
  void *local_20;
  
  ppvVar2 = (this->back_stack_).c.super__Deque_base<const_void_*,_std::allocator<const_void_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_20 = next;
  if (ppvVar2 ==
      (this->back_stack_).c.super__Deque_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<void_const*,std::allocator<void_const*>>::_M_push_back_aux<void_const*const&>
              ((deque<void_const*,std::allocator<void_const*>> *)this,&local_20);
  }
  else {
    *ppvVar2 = next;
    piVar1 = &(this->back_stack_).c.super__Deque_base<const_void_*,_std::allocator<const_void_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  pmVar3 = (xpr->xpr_).px;
  (*(pmVar3->
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._vptr_matchable[3])(pmVar3,this);
  pmVar3 = (xpr->xpr_).px;
  (*(pmVar3->
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._vptr_matchable[4])(pmVar3,peeker);
  return;
}

Assistant:

void alt_branch_link(Xpr const &xpr, void const *next, xpression_peeker<Char> *peeker)
    {
        this->back_stack_.push(next);
        xpr.link(*this);
        xpr.peek(*peeker);
    }